

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O3

int cram_compress_block(cram_fd *fd,cram_block *b,cram_metrics *metrics,int method,int level)

{
  pthread_mutex_t *__mutex;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  FILE *__stream;
  size_t sVar5;
  int iVar6;
  uchar *puVar7;
  uchar *puVar8;
  char *pcVar9;
  int iVar10;
  pthread_mutex_t *__mutex_00;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  cram_block_method cVar20;
  int iVar21;
  int iVar24;
  double dVar23;
  double dVar25;
  double dVar26;
  double dVar27;
  uint out_size_i;
  size_t sz_gz_def;
  size_t sz_gz_rle;
  size_t comp_size;
  cram_block_method local_70;
  uint local_6c;
  ulong local_68;
  size_t local_60;
  size_t local_58;
  size_t local_50;
  ulong local_48;
  pthread_mutex_t *local_40;
  cram_fd *local_38;
  undefined8 uVar22;
  
  local_50 = 0;
  iVar24 = b->uncomp_size;
  if (level == 0 || method == 0) {
LAB_0012c30c:
    b->method = RAW;
    b->comp_size = iVar24;
    return 0;
  }
  if (iVar24 == 0) {
    iVar24 = 0;
    goto LAB_0012c30c;
  }
  if (metrics == (cram_metrics *)0x0) {
    cVar20 = GZIP;
    puVar7 = (uchar *)cram_compress_by_method((char *)b->data,(long)iVar24,&local_50,GZIP,level,1);
    if (puVar7 == (uchar *)0x0) {
      cram_compress_block_cold_1();
      return -1;
    }
    free(b->data);
    b->data = puVar7;
    b->comp_size = (int32_t)local_50;
    b->method = GZIP;
    goto LAB_0012ca3c;
  }
  __mutex = &fd->metrics_lock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((metrics->trial < 1) &&
     (iVar24 = metrics->next_trial, metrics->next_trial = iVar24 + -1, 1 < iVar24)) {
    cVar20 = metrics->method;
    iVar24 = metrics->strat;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    puVar7 = (uchar *)cram_compress_by_method
                                ((char *)b->data,(long)b->uncomp_size,&local_50,cVar20,level,iVar24)
    ;
    if (puVar7 == (uchar *)0x0) {
      return -1;
    }
    free(b->data);
    b->data = puVar7;
    b->comp_size = (int32_t)local_50;
    b->method = cVar20;
    goto LAB_0012ca3c;
  }
  local_58 = 0;
  local_60 = 0;
  uVar16 = metrics->revised_method;
  if (metrics->revised_method == 0) {
    metrics->revised_method = method;
    uVar16 = method;
  }
  if (metrics->next_trial == 0) {
    metrics->trial = 3;
    metrics->next_trial = 0x32;
    metrics->sz_gz_rle = metrics->sz_gz_rle / 2;
    metrics->sz_gz_def = metrics->sz_gz_def / 2;
    metrics->sz_rans0 = metrics->sz_rans0 / 2;
    metrics->sz_rans1 = metrics->sz_rans1 / 2;
    uVar1 = metrics->sz_bzip2;
    uVar3 = metrics->sz_lzma;
    metrics->sz_bzip2 = (int)uVar1 / 2;
    metrics->sz_lzma = (int)uVar3 / 2;
  }
  local_40 = (pthread_mutex_t *)__mutex;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  uVar18 = 0x7fffffff;
  if ((uVar16 >> 0xb & 1) == 0) {
    puVar7 = (uchar *)0x0;
    local_70 = RAW;
  }
  else {
    puVar7 = (uchar *)cram_compress_by_method
                                ((char *)b->data,(long)b->uncomp_size,&local_58,GZIP,1,3);
    if (puVar7 == (uchar *)0x0) {
      local_58 = (long)b->uncomp_size * 2 + 1000;
    }
    else {
      if (local_58 < 0x7fffffff) {
        local_70 = GZIP_RLE;
        uVar18 = local_58;
        goto LAB_0012c438;
      }
      free(puVar7);
    }
    puVar7 = (uchar *)0x0;
    local_70 = RAW;
  }
LAB_0012c438:
  puVar8 = puVar7;
  local_38 = fd;
  if ((uVar16 & 2) != 0) {
    puVar8 = (uchar *)cram_compress_by_method
                                ((char *)b->data,(long)b->uncomp_size,&local_60,GZIP,level,1);
    sVar5 = local_60;
    if (puVar8 == (uchar *)0x0) {
      local_60 = (long)b->uncomp_size * 2 + 1000;
      puVar8 = puVar7;
    }
    else if (local_60 < uVar18) {
      local_70 = GZIP;
      uVar18 = sVar5;
      if (puVar7 != (uchar *)0x0) {
        free(puVar7);
      }
    }
    else {
      free(puVar8);
      puVar8 = puVar7;
    }
  }
  if ((uVar16 & 0x10) == 0) {
    local_68 = 0;
    puVar7 = puVar8;
  }
  else {
    puVar7 = rans_compress(b->data,b->uncomp_size,&local_6c,0);
    if (puVar7 == (uchar *)0x0) {
      local_68 = (ulong)(b->uncomp_size * 2 + 1000);
      puVar7 = puVar8;
    }
    else {
      local_68 = (ulong)local_6c;
      if (local_68 < uVar18) {
        local_70 = RANS;
        uVar18 = local_68;
        if (puVar8 != (uchar *)0x0) {
          free(puVar8);
          uVar18 = local_68;
        }
      }
      else {
        free(puVar7);
        puVar7 = puVar8;
      }
    }
  }
  uVar19 = uVar18;
  if ((uVar16 >> 10 & 1) == 0) {
    local_48 = 0;
    puVar8 = puVar7;
  }
  else {
    puVar8 = rans_compress(b->data,b->uncomp_size,&local_6c,1);
    if (puVar8 == (uchar *)0x0) {
      puVar8 = puVar7;
      local_48 = (ulong)(b->uncomp_size * 2 + 1000);
    }
    else {
      uVar19 = (ulong)local_6c;
      local_48 = uVar19;
      if (uVar19 < uVar18) {
        local_70 = RANS1;
        if (puVar7 != (uchar *)0x0) {
          free(puVar7);
        }
      }
      else {
        free(puVar8);
        puVar8 = puVar7;
        uVar19 = uVar18;
      }
    }
  }
  iVar17 = 0;
  iVar24 = 0;
  if ((uVar16 & 4) != 0) {
    iVar24 = b->uncomp_size * 2 + 1000;
  }
  if ((uVar16 & 8) != 0) {
    iVar17 = b->uncomp_size * 2 + 1000;
  }
  free(b->data);
  __mutex_00 = local_40;
  b->data = puVar8;
  cVar20 = GZIP;
  if (local_70 != GZIP_RLE) {
    cVar20 = local_70;
  }
  b->method = cVar20;
  b->comp_size = (int32_t)uVar19;
  pthread_mutex_lock(local_40);
  fd = local_38;
  iVar12 = metrics->sz_gz_rle + (int)local_58;
  metrics->sz_gz_rle = iVar12;
  iVar11 = metrics->sz_gz_def + (int)local_60;
  metrics->sz_gz_def = iVar11;
  iVar6 = (int)local_68 + metrics->sz_rans0;
  metrics->sz_rans0 = iVar6;
  uVar2 = metrics->sz_rans1;
  uVar4 = metrics->sz_bzip2;
  iVar21 = (int)local_48 + uVar2;
  iVar24 = iVar24 + uVar4;
  uVar22 = CONCAT44(iVar24,iVar21);
  metrics->sz_rans1 = iVar21;
  metrics->sz_bzip2 = iVar24;
  iVar17 = iVar17 + metrics->sz_lzma;
  metrics->sz_lzma = iVar17;
  metrics->trial = metrics->trial + -1;
  if (metrics->trial == 0) {
    if (local_38->level < 4) {
      dVar23 = 1.02;
      dVar26 = 1.08;
      dVar25 = 1.1;
      dVar27 = 1.04;
LAB_0012c6aa:
      iVar11 = (int)((double)iVar11 * dVar27);
      metrics->sz_gz_def = iVar11;
      uVar22 = CONCAT44((int)((double)iVar24 * dVar26),(int)((double)iVar21 * dVar23));
      metrics->sz_rans1 = (int)((double)iVar21 * dVar23);
      metrics->sz_bzip2 = (int)((double)iVar24 * dVar26);
      iVar17 = (int)((double)iVar17 * dVar25);
      metrics->sz_lzma = iVar17;
    }
    else if ((uint)local_38->level < 7) {
      dVar23 = 1.01;
      dVar26 = 1.03;
      dVar25 = 1.05;
      dVar27 = 1.02;
      goto LAB_0012c6aa;
    }
    iVar24 = (int)uVar22;
    iVar21 = (int)((ulong)uVar22 >> 0x20);
    uVar13 = 0xb;
    if (iVar12 == 0x7fffffff) {
      uVar13 = 0;
    }
    uVar13 = uVar13 & (int)(uVar16 << 0x14) >> 0x1f;
    iVar10 = 0x7fffffff;
    if ((uVar16 >> 0xb & 1) != 0) {
      iVar10 = iVar12;
    }
    if ((uVar16 & 2) != 0) {
      if (iVar11 < iVar10) {
        uVar13 = 1;
      }
      if (iVar11 <= iVar10) {
        iVar10 = iVar11;
      }
    }
    uVar15 = 4;
    if (iVar10 <= iVar6) {
      uVar15 = uVar13;
    }
    iVar14 = iVar6;
    if (iVar10 < iVar6) {
      iVar14 = iVar10;
    }
    if ((uVar16 & 0x10) == 0) {
      iVar14 = iVar10;
      uVar15 = uVar13;
    }
    if ((uVar16 >> 10 & 1) != 0) {
      if (iVar24 < iVar14) {
        uVar15 = 10;
      }
      if (iVar24 <= iVar14) {
        iVar14 = iVar24;
      }
    }
    if ((uVar16 & 4) != 0) {
      if (iVar21 < iVar14) {
        uVar15 = 2;
      }
      if (iVar21 <= iVar14) {
        iVar14 = iVar21;
      }
    }
    if ((((uVar16 & 8) == 0) || (iVar10 = iVar17, uVar13 = 3, iVar14 <= iVar17)) &&
       (iVar10 = iVar14, uVar13 = uVar15, uVar15 == 0xb)) {
      metrics->method = 1;
      metrics->strat = 3;
      metrics->gz_rle_cnt = 0;
      metrics->gz_rle_extra = 0.0;
      uVar13 = 0xb;
LAB_0012c83e:
      if (((iVar14 < iVar11) &&
          (iVar12 = metrics->gz_def_cnt, metrics->gz_def_cnt = iVar12 + 1, 2 < iVar12)) &&
         (dVar23 = (double)iVar11 / (double)iVar14 + -1.0 + metrics->gz_def_extra,
         metrics->gz_def_extra = dVar23, 0.2 <= dVar23)) {
        uVar16 = uVar16 & 0xfffffffd;
      }
      if (uVar13 != 4) goto LAB_0012c8a8;
      metrics->rans0_cnt = 0;
      metrics->rans0_extra = 0.0;
      uVar13 = 4;
LAB_0012c912:
      if (((iVar14 < iVar24) &&
          (iVar6 = metrics->rans1_cnt, metrics->rans1_cnt = iVar6 + 1, 2 < iVar6)) &&
         (dVar23 = (double)iVar24 / (double)iVar14 + -1.0 + metrics->rans1_extra,
         metrics->rans1_extra = dVar23, 0.2 <= dVar23)) {
        uVar16 = uVar16 & 0xfffffbff;
      }
      if (uVar13 != 2) goto LAB_0012c979;
      metrics->bzip2_cnt = 0;
      metrics->bzip2_extra = 0.0;
LAB_0012c9dd:
      if (((iVar14 < iVar17) &&
          (iVar24 = metrics->lzma_cnt, metrics->lzma_cnt = iVar24 + 1, 2 < iVar24)) &&
         (dVar23 = (double)iVar17 / (double)iVar14 + -1.0 + metrics->lzma_extra,
         metrics->lzma_extra = dVar23, 0.2 <= dVar23)) {
        uVar16 = uVar16 & 0xfffffff7;
      }
    }
    else {
      iVar14 = iVar10;
      metrics->method = uVar13;
      metrics->strat = 1;
      if (((iVar14 < iVar12) &&
          (iVar10 = metrics->gz_rle_cnt, metrics->gz_rle_cnt = iVar10 + 1, 2 < iVar10)) &&
         (dVar23 = (double)iVar12 / (double)iVar14 + -1.0 + metrics->gz_rle_extra,
         metrics->gz_rle_extra = dVar23, 0.2 <= dVar23)) {
        uVar16 = uVar16 & 0xfffff7ff;
      }
      if (uVar13 != 1) goto LAB_0012c83e;
      metrics->gz_def_cnt = 0;
      metrics->gz_def_extra = 0.0;
      uVar13 = 1;
LAB_0012c8a8:
      if (((iVar14 < iVar6) &&
          (iVar11 = metrics->rans0_cnt, metrics->rans0_cnt = iVar11 + 1, 2 < iVar11)) &&
         (dVar23 = (double)iVar6 / (double)iVar14 + -1.0 + metrics->rans0_extra,
         metrics->rans0_extra = dVar23, 0.2 <= dVar23)) {
        uVar16 = uVar16 & 0xffffffef;
      }
      if (uVar13 != 10) goto LAB_0012c912;
      metrics->rans1_cnt = 0;
      metrics->rans1_extra = 0.0;
      uVar13 = 10;
LAB_0012c979:
      if (((iVar14 < iVar21) &&
          (iVar24 = metrics->bzip2_cnt, metrics->bzip2_cnt = iVar24 + 1, 2 < iVar24)) &&
         (dVar23 = (double)iVar21 / (double)iVar14 + -1.0 + metrics->bzip2_extra,
         metrics->bzip2_extra = dVar23, 0.2 <= dVar23)) {
        uVar16 = uVar16 & 0xfffffffb;
      }
      if (uVar13 != 3) goto LAB_0012c9dd;
      metrics->lzma_cnt = 0;
      metrics->lzma_extra = 0.0;
    }
    metrics->revised_method = uVar16;
    __mutex_00 = local_40;
  }
  pthread_mutex_unlock(__mutex_00);
  cVar20 = b->method;
LAB_0012ca3c:
  __stream = _stderr;
  if (fd->verbose != 0) {
    uVar16 = b->uncomp_size;
    uVar13 = b->content_id;
    uVar15 = b->comp_size;
    pcVar9 = cram_block_method2str(cVar20);
    fprintf(__stream,"Compressed block ID %d from %d to %d by method %s\n",(ulong)uVar13,
            (ulong)uVar16,(ulong)uVar15,pcVar9);
    cVar20 = b->method;
  }
  if (cVar20 == RANS1) {
    b->method = RANS;
    return 0;
  }
  return 0;
}

Assistant:

int cram_compress_block(cram_fd *fd, cram_block *b, cram_metrics *metrics,
			int method, int level) {

    char *comp = NULL;
    size_t comp_size = 0;
    int strat;

    //fprintf(stderr, "IN: block %d, sz %d\n", b->content_id, b->uncomp_size);

    if (method == RAW || level == 0 || b->uncomp_size == 0) {
	b->method = RAW;
	b->comp_size = b->uncomp_size;
	//fprintf(stderr, "Skip block id %d\n", b->content_id);
	return 0;
    }

    if (metrics) {
	pthread_mutex_lock(&fd->metrics_lock);
	if (metrics->trial > 0 || --metrics->next_trial <= 0) {
	    size_t sz_best = INT_MAX;
	    size_t sz_gz_rle = 0;
	    size_t sz_gz_def = 0;
	    size_t sz_rans0 = 0;
	    size_t sz_rans1 = 0;
	    size_t sz_bzip2 = 0;
	    size_t sz_lzma = 0;
	    int method_best = 0;
	    char *c_best = NULL, *c = NULL;

	    if (metrics->revised_method)
		method = metrics->revised_method;
	    else
		metrics->revised_method = method;

	    if (metrics->next_trial == 0) {
		metrics->next_trial = TRIAL_SPAN;
		metrics->trial = NTRIALS;
		metrics->sz_gz_rle /= 2;
		metrics->sz_gz_def /= 2;
		metrics->sz_rans0  /= 2;
		metrics->sz_rans1  /= 2;
		metrics->sz_bzip2  /= 2;
		metrics->sz_lzma   /= 2;
	    }

	    pthread_mutex_unlock(&fd->metrics_lock);
	    
	    if (method & (1<<GZIP_RLE)) {
		c = cram_compress_by_method((char *)b->data, b->uncomp_size,
					    &sz_gz_rle, GZIP, 1, Z_RLE);
		if (c && sz_best > sz_gz_rle) {
		    sz_best = sz_gz_rle;
		    method_best = GZIP_RLE;
		    if (c_best)
			free(c_best);
		    c_best = c;
		} else if (c) {
		    free(c);
		} else {
		    sz_gz_rle = b->uncomp_size*2+1000;
		}

		//fprintf(stderr, "Block %d; %d->%d\n", b->content_id, b->uncomp_size, sz_gz_rle);
	    }

	    if (method & (1<<GZIP)) {
		c = cram_compress_by_method((char *)b->data, b->uncomp_size,
					    &sz_gz_def, GZIP, level,
					    Z_FILTERED);
		if (c && sz_best > sz_gz_def) {
		    sz_best = sz_gz_def;
		    method_best = GZIP;
		    if (c_best)
			free(c_best);
		    c_best = c;
		} else if (c) {
		    free(c);
		} else {
		    sz_gz_def = b->uncomp_size*2+1000;
		}

		//fprintf(stderr, "Block %d; %d->%d\n", b->content_id, b->uncomp_size, sz_gz_def);
	    }

	    if (method & (1<<RANS0)) {
		c = cram_compress_by_method((char *)b->data, b->uncomp_size,
					    &sz_rans0, RANS0, 0, 0);
		if (c && sz_best > sz_rans0) {
		    sz_best = sz_rans0;
		    method_best = RANS0;
		    if (c_best)
			free(c_best);
		    c_best = c;
		} else if (c) {
		    free(c);
		} else {
		    sz_rans0 = b->uncomp_size*2+1000;
		}
	    }

	    if (method & (1<<RANS1)) {
		c = cram_compress_by_method((char *)b->data, b->uncomp_size,
					    &sz_rans1, RANS1, 0, 0);
		if (c && sz_best > sz_rans1) {
		    sz_best = sz_rans1;
		    method_best = RANS1;
		    if (c_best)
			free(c_best);
		    c_best = c;
		} else if (c) {
		    free(c);
		} else {
		    sz_rans1 = b->uncomp_size*2+1000;
		}
	    }

	    if (method & (1<<BZIP2)) {
		c = cram_compress_by_method((char *)b->data, b->uncomp_size,
					    &sz_bzip2, BZIP2, level, 0);
		if (c && sz_best > sz_bzip2) {
		    sz_best = sz_bzip2;
		    method_best = BZIP2;
		    if (c_best)
			free(c_best);
		    c_best = c;
		} else if (c) {
		    free(c);
		} else {
		    sz_bzip2 = b->uncomp_size*2+1000;
		}
	    }

	    if (method & (1<<LZMA)) {
		c = cram_compress_by_method((char *)b->data, b->uncomp_size,
					    &sz_lzma, LZMA, level, 0);
		if (c && sz_best > sz_lzma) {
		    sz_best = sz_lzma;
		    method_best = LZMA;
		    if (c_best)
			free(c_best);
		    c_best = c;
		} else if (c) {
		    free(c);
		} else {
		    sz_lzma = b->uncomp_size*2+1000;
		}
	    }

	    //fprintf(stderr, "sz_best = %d\n", sz_best);

	    free(b->data);
	    b->data = (unsigned char *)c_best;
	    //printf("method_best = %s\n", cram_block_method2str(method_best));
	    b->method = method_best == GZIP_RLE ? GZIP : method_best;
	    b->comp_size = sz_best;

	    pthread_mutex_lock(&fd->metrics_lock);
	    metrics->sz_gz_rle += sz_gz_rle;
	    metrics->sz_gz_def += sz_gz_def;
	    metrics->sz_rans0  += sz_rans0;
	    metrics->sz_rans1  += sz_rans1;
	    metrics->sz_bzip2  += sz_bzip2;
	    metrics->sz_lzma   += sz_lzma;
	    if (--metrics->trial == 0) {
		int best_method = RAW;
		int best_sz = INT_MAX;

		// Scale methods by cost
		if (fd->level <= 3) {
		    metrics->sz_rans1  *= 1.02;
		    metrics->sz_gz_def *= 1.04;
		    metrics->sz_bzip2  *= 1.08;
		    metrics->sz_lzma   *= 1.10;
		} else if (fd->level <= 6) {
		    metrics->sz_rans1  *= 1.01;
		    metrics->sz_gz_def *= 1.02;
		    metrics->sz_bzip2  *= 1.03;
		    metrics->sz_lzma   *= 1.05;
		}

		if (method & (1<<GZIP_RLE) && best_sz > metrics->sz_gz_rle)
		    best_sz = metrics->sz_gz_rle, best_method = GZIP_RLE;

		if (method & (1<<GZIP) && best_sz > metrics->sz_gz_def)
		    best_sz = metrics->sz_gz_def, best_method = GZIP;

		if (method & (1<<RANS0) && best_sz > metrics->sz_rans0)
		    best_sz = metrics->sz_rans0, best_method = RANS0;

		if (method & (1<<RANS1) && best_sz > metrics->sz_rans1)
		    best_sz = metrics->sz_rans1, best_method = RANS1;

		if (method & (1<<BZIP2) && best_sz > metrics->sz_bzip2)
		    best_sz = metrics->sz_bzip2, best_method = BZIP2;

		if (method & (1<<LZMA) && best_sz > metrics->sz_lzma)
		    best_sz = metrics->sz_lzma, best_method = LZMA;

		if (best_method == GZIP_RLE) {
		    metrics->method = GZIP;
		    metrics->strat  = Z_RLE;
		} else {
		    metrics->method = best_method;
		    metrics->strat  = Z_FILTERED;
		}

		// If we see at least MAXFAIL trials in a row for a specific
		// compression method with more than MAXDELTA aggregate
		// size then we drop this from the list of methods used
		// for this block type.
#define MAXDELTA 0.20
#define MAXFAILS 4
		if (best_method == GZIP_RLE) {
		    metrics->gz_rle_cnt = 0;
		    metrics->gz_rle_extra = 0;
		} else if (best_sz < metrics->sz_gz_rle) {
		    double r = (double)metrics->sz_gz_rle / best_sz - 1;
		    if (++metrics->gz_rle_cnt >= MAXFAILS && 
			(metrics->gz_rle_extra += r) >= MAXDELTA)
			method &= ~(1<<GZIP_RLE);
		}

		if (best_method == GZIP) {
		    metrics->gz_def_cnt = 0;
		    metrics->gz_def_extra = 0;
		} else if (best_sz < metrics->sz_gz_def) {
		    double r = (double)metrics->sz_gz_def / best_sz - 1;
		    if (++metrics->gz_def_cnt >= MAXFAILS &&
			(metrics->gz_def_extra += r) >= MAXDELTA)
			method &= ~(1<<GZIP);
		}

		if (best_method == RANS0) {
		    metrics->rans0_cnt = 0;
		    metrics->rans0_extra = 0;
		} else if (best_sz < metrics->sz_rans0) {
		    double r = (double)metrics->sz_rans0 / best_sz - 1;
		    if (++metrics->rans0_cnt >= MAXFAILS &&
			(metrics->rans0_extra += r) >= MAXDELTA)
			method &= ~(1<<RANS0);
		}

		if (best_method == RANS1) {
		    metrics->rans1_cnt = 0;
		    metrics->rans1_extra = 0;
		} else if (best_sz < metrics->sz_rans1) {
		    double r = (double)metrics->sz_rans1 / best_sz - 1;
		    if (++metrics->rans1_cnt >= MAXFAILS &&
			(metrics->rans1_extra += r) >= MAXDELTA)
			method &= ~(1<<RANS1);
		}

		if (best_method == BZIP2) {
		    metrics->bzip2_cnt = 0;
		    metrics->bzip2_extra = 0;
		} else if (best_sz < metrics->sz_bzip2) {
		    double r = (double)metrics->sz_bzip2 / best_sz - 1;
		    if (++metrics->bzip2_cnt >= MAXFAILS &&
			(metrics->bzip2_extra += r) >= MAXDELTA)
			method &= ~(1<<BZIP2);
		}

		if (best_method == LZMA) {
		    metrics->lzma_cnt = 0;
		    metrics->lzma_extra = 0;
		} else if (best_sz < metrics->sz_lzma) {
		    double r = (double)metrics->sz_lzma / best_sz - 1;
		    if (++metrics->lzma_cnt >= MAXFAILS &&
			(metrics->lzma_extra += r) >= MAXDELTA)
			method &= ~(1<<LZMA);
		}

		//if (method != metrics->revised_method)
		//    fprintf(stderr, "%d: method from %x to %x\n",
		//	    b->content_id, metrics->revised_method, method);
		metrics->revised_method = method;
	    }
	    pthread_mutex_unlock(&fd->metrics_lock);
	} else {
	    strat = metrics->strat;
	    method = metrics->method;

	    pthread_mutex_unlock(&fd->metrics_lock);
	    comp = cram_compress_by_method((char *)b->data, b->uncomp_size,
					   &comp_size, method,
					   level, strat);
	    if (!comp)
		return -1;
	    free(b->data);
	    b->data = (unsigned char *)comp;
	    b->comp_size = comp_size;
	    b->method = method;
	}

    } else {
	// no cached metrics, so just do zlib?
	comp = cram_compress_by_method((char *)b->data, b->uncomp_size,
				       &comp_size, GZIP, level, Z_FILTERED);
	if (!comp) {
	    fprintf(stderr, "Compression failed!\n");
	    return -1;
	}
	free(b->data);
	b->data = (unsigned char *)comp;
	b->comp_size = comp_size;
	b->method = GZIP;
    }

    if (fd->verbose)
	fprintf(stderr, "Compressed block ID %d from %d to %d by method %s\n",
		b->content_id, b->uncomp_size, b->comp_size,
		cram_block_method2str(b->method));

    if (b->method == RANS1)
	b->method = RANS0; // Spec just has RANS (not 0/1) with auto-sensing

    return 0;
}